

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode parse_port(Curl_URL *u,char *hostname)

{
  int iVar1;
  long lVar2;
  CURLUcode CVar3;
  char *pcVar4;
  char endbracket;
  int len;
  char *rest;
  char portbuf [7];
  char local_3d;
  int local_3c;
  char *local_38;
  char local_2f [7];
  
  iVar1 = __isoc99_sscanf(hostname,"[%*45[0123456789abcdefABCDEF:.%%]%c%n",&local_3d,&local_3c);
  if ((iVar1 == 1) && (local_3d == ']')) {
    if (hostname[local_3c] != ':') {
      return CURLUE_MALFORMED_INPUT;
    }
    pcVar4 = hostname + local_3c;
  }
  else {
    pcVar4 = strchr(hostname,0x3a);
    if (pcVar4 == (char *)0x0) {
      return CURLUE_OK;
    }
  }
  iVar1 = Curl_isdigit((uint)(byte)pcVar4[1]);
  CVar3 = CURLUE_BAD_PORT_NUMBER;
  if (iVar1 != 0) {
    lVar2 = strtol(pcVar4 + 1,&local_38,10);
    if ((0xffffffffffff0000 < lVar2 - 0x10000U) && (*local_38 == '\0')) {
      *pcVar4 = '\0';
      if (local_38 != pcVar4 + 1) {
        *local_38 = '\0';
        curl_msnprintf(local_2f,7,"%ld",lVar2);
        u->portnum = lVar2;
        pcVar4 = (*Curl_cstrdup)(local_2f);
        u->port = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      CVar3 = CURLUE_OK;
    }
  }
  return CVar3;
}

Assistant:

static CURLUcode parse_port(struct Curl_URL *u, char *hostname)
{
  char *portptr;
  char endbracket;
  int len;

  if((1 == sscanf(hostname, "[%*45[0123456789abcdefABCDEF:.%%]%c%n",
                  &endbracket, &len)) &&
     (']' == endbracket)) {
    /* this is a RFC2732-style specified IP-address */
    portptr = &hostname[len];
    if (*portptr != ':')
      return CURLUE_MALFORMED_INPUT;
  }
  else
    portptr = strchr(hostname, ':');

  if(portptr) {
    char *rest;
    long port;
    char portbuf[7];

    if(!ISDIGIT(portptr[1]))
      return CURLUE_BAD_PORT_NUMBER;

    port = strtol(portptr + 1, &rest, 10);  /* Port number must be decimal */

    if((port <= 0) || (port > 0xffff))
      /* Single unix standard says port numbers are 16 bits long, but we don't
         treat port zero as OK. */
      return CURLUE_BAD_PORT_NUMBER;

    if(rest[0])
      return CURLUE_BAD_PORT_NUMBER;

    if(rest != &portptr[1]) {
      *portptr++ = '\0'; /* cut off the name there */
      *rest = 0;
      /* generate a new to get rid of leading zeroes etc */
      snprintf(portbuf, sizeof(portbuf), "%ld", port);
      u->portnum = port;
      u->port = strdup(portbuf);
      if(!u->port)
        return CURLUE_OUT_OF_MEMORY;
    }
    else {
      /* Browser behavior adaptation. If there's a colon with no digits after,
         just cut off the name there which makes us ignore the colon and just
         use the default port. Firefox and Chrome both do that. */
      *portptr = '\0';
    }
  }

  return CURLUE_OK;
}